

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O3

void __thiscall
miniros::Publication::removeCallbacks(Publication *this,SubscriberCallbacksPtr *callbacks)

{
  CallbackQueueInterface *pCVar1;
  int iVar2;
  __normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>_*,_std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>_>
  __position;
  SubscriberCallbacksPtr *cb;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->callbacks_mutex_);
  if (iVar2 == 0) {
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<miniros::SubscriberCallbacks>*,std::vector<std::shared_ptr<miniros::SubscriberCallbacks>,std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<miniros::SubscriberCallbacks>const>>
                           ((this->callbacks_).
                            super__Vector_base<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->callbacks_).
                            super__Vector_base<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,callbacks);
    if (__position._M_current !=
        (this->callbacks_).
        super__Vector_base<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar1 = (((__position._M_current)->
                super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->callback_queue_;
      if (pCVar1 != (CallbackQueueInterface *)0x0) {
        (*pCVar1->_vptr_CallbackQueueInterface[3])();
      }
      std::
      vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
      ::_M_erase(&this->callbacks_,(iterator)__position._M_current);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->callbacks_mutex_);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void Publication::removeCallbacks(const SubscriberCallbacksPtr& callbacks)
{
  std::scoped_lock<std::mutex> lock(callbacks_mutex_);

  V_Callback::iterator it = std::find(callbacks_.begin(), callbacks_.end(), callbacks);
  if (it != callbacks_.end())
  {
    const SubscriberCallbacksPtr& cb = *it;
    if (cb->callback_queue_)
    {
      cb->callback_queue_->removeByID((uint64_t)cb.get());
    }
    callbacks_.erase(it);
  }
}